

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::RenderHeatmap<unsigned_int,ImPlot::TransformerLinLin>
               (TransformerLinLin transformer,ImDrawList *DrawList,uint *values,int rows,int cols,
               double scale_min,double scale_max,char *fmt,ImPlotPoint *bounds_min,
               ImPlotPoint *bounds_max)

{
  ImPlotContext *pIVar1;
  ImU32 col_00;
  double dVar2;
  double dVar3;
  ImVec4 IVar4;
  ImVec2 local_14c;
  ImVec2 local_144;
  ImU32 local_13c;
  undefined1 auStack_138 [4];
  ImU32 col_1;
  ImVec4 color_1;
  double t_1;
  ImVec2 size;
  char buff [32];
  ImVec2 px;
  ImPlotPoint p_1;
  int local_d8;
  int c_1;
  int r_1;
  ImU32 col;
  ImVec4 color;
  double t;
  ImVec2 local_a8;
  ImVec2 b;
  ImVec2 local_90;
  ImVec2 a;
  ImPlotPoint p;
  int local_70;
  int c;
  int r;
  int i;
  ImPlotPoint half_size;
  double h;
  double w;
  ImPlotContext *gp;
  char *fmt_local;
  double scale_max_local;
  double scale_min_local;
  int cols_local;
  int rows_local;
  uint *values_local;
  ImDrawList *DrawList_local;
  TransformerLinLin transformer_local;
  
  pIVar1 = GImPlot;
  dVar2 = (bounds_max->x - bounds_min->x) / (double)cols;
  half_size.y = (bounds_max->y - bounds_min->y) / (double)rows;
  DrawList_local._4_4_ = transformer.YAxis;
  ImPlotPoint::ImPlotPoint((ImPlotPoint *)&r,dVar2 * 0.5,half_size.y * 0.5);
  c = 0;
  for (local_70 = 0; local_70 < rows; local_70 = local_70 + 1) {
    for (p.y._4_4_ = 0; p.y._4_4_ < cols; p.y._4_4_ = p.y._4_4_ + 1) {
      ImPlotPoint::ImPlotPoint((ImPlotPoint *)&a);
      a = (ImVec2)((double)p.y._4_4_ * dVar2 + dVar2 * 0.5 + bounds_min->x);
      dVar3 = bounds_max->y - (half_size.y * 0.5 + (double)local_70 * half_size.y);
      ImPlotPoint::ImPlotPoint((ImPlotPoint *)&b,(double)a - _r,dVar3 - half_size.x);
      local_90 = TransformerLinLin::operator()
                           ((TransformerLinLin *)((long)&DrawList_local + 4),(ImPlotPoint *)&b);
      ImPlotPoint::ImPlotPoint((ImPlotPoint *)&t,(double)a + _r,dVar3 + half_size.x);
      local_a8 = TransformerLinLin::operator()
                           ((TransformerLinLin *)((long)&DrawList_local + 4),(ImPlotPoint *)&t);
      color._8_8_ = ImRemap<double>((double)values[c],scale_min,scale_max,0.0,1.0);
      IVar4 = LerpColormap((float)(double)color._8_8_);
      color.y = IVar4.w;
      _r_1 = IVar4._0_12_;
      color.y = (pIVar1->Style).FillAlpha * color.y;
      col_00 = ImGui::GetColorU32((ImVec4 *)&r_1);
      ImDrawList::AddRectFilled(DrawList,&local_90,&local_a8,col_00,0.0,0xf);
      c = c + 1;
    }
  }
  if (fmt != (char *)0x0) {
    c = 0;
    for (local_d8 = 0; local_d8 < rows; local_d8 = local_d8 + 1) {
      for (p_1.y._4_4_ = 0; p_1.y._4_4_ < cols; p_1.y._4_4_ = p_1.y._4_4_ + 1) {
        ImPlotPoint::ImPlotPoint((ImPlotPoint *)&px);
        px = (ImVec2)((double)p_1.y._4_4_ * dVar2 + dVar2 * 0.5 + bounds_min->x);
        buff._24_8_ = TransformerLinLin::operator()
                                ((TransformerLinLin *)((long)&DrawList_local + 4),(ImPlotPoint *)&px
                                );
        sprintf((char *)&size,fmt,(ulong)values[c]);
        t_1 = (double)ImGui::CalcTextSize((char *)&size,(char *)0x0,false,-1.0);
        color_1._8_8_ = ImRemap<double>((double)values[c],scale_min,scale_max,0.0,1.0);
        _auStack_138 = LerpColormap((float)(double)color_1._8_8_);
        local_13c = CalcTextColor((ImVec4 *)auStack_138);
        local_14c = ::operator*((ImVec2 *)&t_1,0.5);
        local_144 = ::operator-((ImVec2 *)(buff + 0x18),&local_14c);
        ImDrawList::AddText(DrawList,&local_144,local_13c,(char *)&size,(char *)0x0);
        c = c + 1;
      }
    }
  }
  return;
}

Assistant:

void RenderHeatmap(Transformer transformer, ImDrawList& DrawList, const T* values, int rows, int cols, double scale_min, double scale_max, const char* fmt, const ImPlotPoint& bounds_min, const ImPlotPoint& bounds_max) {
    ImPlotContext& gp = *GImPlot;
    const double w = (bounds_max.x - bounds_min.x) / cols;
    const double h = (bounds_max.y - bounds_min.y) / rows;
    const ImPlotPoint half_size(w*0.5,h*0.5);
    int i = 0;
    for (int r = 0; r < rows; ++r) {
        for (int c = 0; c < cols; ++c) {
            ImPlotPoint p;
            p.x = bounds_min.x + 0.5*w + c*w;
            p.y = bounds_max.y - (0.5*h + r*h);
            ImVec2 a  = transformer(ImPlotPoint(p.x - half_size.x, p.y - half_size.y));
            ImVec2 b  = transformer(ImPlotPoint(p.x + half_size.x, p.y + half_size.y));
            double t = ImRemap((double)values[i], scale_min, scale_max, 0.0, 1.0);
            ImVec4 color = LerpColormap((float)t);
            color.w *= gp.Style.FillAlpha;
            ImU32 col = ImGui::GetColorU32(color);
            DrawList.AddRectFilled(a, b, col);
            i++;
        }
    }
    if (fmt != NULL) {
        i = 0;
        for (int r = 0; r < rows; ++r) {
            for (int c = 0; c < cols; ++c) {
                ImPlotPoint p;
                p.x = bounds_min.x + 0.5*w + c*w;
                p.y = bounds_min.y + 1 - (0.5*h + r*h);
                ImVec2 px = transformer(p);
                char buff[32];
                sprintf(buff, fmt, values[i]);
                ImVec2 size = ImGui::CalcTextSize(buff);
                double t = ImRemap((double)values[i], scale_min, scale_max, 0.0, 1.0);
                ImVec4 color = LerpColormap((float)t);
                ImU32 col = CalcTextColor(color);
                DrawList.AddText(px - size * 0.5f, col, buff);
                i++;
            }
        }
    }
}